

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Promise<void> __thiscall
capnp::LocalClient::callInternal
          (LocalClient *this,uint64_t interfaceId,uint16_t methodId,CallContextHook *context)

{
  undefined8 *puVar1;
  BlockedCall *this_00;
  Disposer *pDVar2;
  CallContextHook *pCVar3;
  BlockingScope node;
  long *plVar4;
  OwnPromiseNode OVar5;
  char *pcVar6;
  size_t sVar7;
  undefined6 in_register_00000012;
  long *in_R8;
  LocalClient *c;
  DispatchCallResult result;
  Fault f;
  Own<capnp::CallContextHook,_std::nullptr_t> local_218;
  Own<capnp::LocalClient,_std::nullptr_t> local_208;
  IdentityFunc<void> local_1f1;
  BlockingScope local_1f0;
  long *local_1e8;
  OwnPromiseNode local_1e0;
  OwnPromiseNode local_1d8;
  char *local_1d0;
  char *pcStack_1c8;
  OwnPromiseNode local_1c0;
  Exception local_1b8;
  
  local_208.disposer =
       (Disposer *)(CONCAT71(local_208.disposer._1_7_,*(char *)(interfaceId + 0x78)) ^ 1);
  if (*(char *)(interfaceId + 0x78) != '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
               ,0x358,FAILED,"!blocked","_kjCondition,",(DebugExpression<bool> *)&local_208);
    kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
  }
  if (*(char *)(interfaceId + 0x80) == '\x01') {
    kj::Exception::Exception(&local_1b8,(Exception *)(interfaceId + 0x88));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_208,&local_1b8);
    pDVar2 = local_208.disposer;
    local_208.disposer = (Disposer *)0x0;
    (this->super_ClientHook)._vptr_ClientHook = (_func_int **)pDVar2;
    kj::Exception::~Exception(&local_1b8);
  }
  else {
    puVar1 = *(undefined8 **)(interfaceId + 0x28);
    if (puVar1 == (undefined8 *)0x0) {
      local_218.disposer = (Disposer *)0x0;
      local_1b8.ownFile.content.ptr = (char *)0x0;
      local_1b8.ownFile.content.size_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_218,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_218);
    }
    (**(code **)*puVar1)
              (&local_208,puVar1,CONCAT62(in_register_00000012,methodId),(ulong)context & 0xffff);
    if (*(char *)(interfaceId + 0x68) == '\x01') {
      local_1d8.ptr = (PromiseNode *)local_208.disposer;
      local_208.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
                ((PromiseDisposer *)&local_1b8,(Canceler *)(interfaceId + 0x70),
                 (Promise<void> *)&local_1d8);
      pDVar2 = local_208.disposer;
      local_208.disposer = (Disposer *)local_1b8.ownFile.content.ptr;
      if ((PromiseArenaMember *)pDVar2 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar2);
      }
      OVar5.ptr = local_1d8.ptr;
      if (&(local_1d8.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_1d8.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
      }
    }
    if (local_208.ptr._1_1_ == '\0') {
      *(int *)(interfaceId + 0x18) = *(int *)(interfaceId + 0x18) + 1;
      local_218.disposer = (Disposer *)(interfaceId + 0x10);
      local_218.ptr = (CallContextHook *)interfaceId;
      (**(code **)(*in_R8 + 0x38))(&local_1f0);
      kj::Promise<void>::
      attach<kj::Own<capnp::LocalClient,decltype(nullptr)>,kj::Own<capnp::CallContextHook,decltype(nullptr)>>
                ((Promise<void> *)&local_1e0,&local_208,&local_218);
      local_1d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
      ;
      pcStack_1c8 = "callInternal";
      local_1c0.ptr = (PromiseNode *)0x1300000369;
      kj::Promise<void>::fork((Promise<void> *)&local_1b8);
      OVar5.ptr = local_1e0.ptr;
      if (&(local_1e0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_1e0.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
      }
      plVar4 = local_1e8;
      if (local_1e8 != (long *)0x0) {
        local_1e8 = (long *)0x0;
        (*(code *)**(undefined8 **)local_1f0.client.ptr)
                  (local_1f0.client.ptr,(long)plVar4 + *(long *)(*plVar4 + -0x10));
      }
      pCVar3 = local_218.ptr;
      if ((PromiseArena *)local_218.ptr != (PromiseArena *)0x0) {
        local_218.ptr = (CallContextHook *)0x0;
        (**(local_218.disposer)->_vptr_Disposer)
                  (local_218.disposer,
                   pCVar3->_vptr_CallContextHook[-2] + (long)&pCVar3->_vptr_CallContextHook);
      }
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&local_218);
      pDVar2 = local_208.disposer;
      local_208.disposer = local_218.disposer;
      local_218.disposer = (Disposer *)0x0;
      if ((PromiseArenaMember *)pDVar2 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar2);
      }
      pDVar2 = local_218.disposer;
      if ((LocalClient *)local_218.disposer != (LocalClient *)0x0) {
        local_218.disposer = (Disposer *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar2);
      }
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&local_218);
      kj::Promise<void>::
      detach<capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_1_>
                ((Promise<void> *)&local_218,(anon_class_1_0_00000001_for_errorHandler *)&local_1f0)
      ;
      pDVar2 = local_218.disposer;
      if ((LocalClient *)local_218.disposer != (LocalClient *)0x0) {
        local_218.disposer = (Disposer *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar2);
      }
      sVar7 = local_1b8.ownFile.content.size_;
      if ((ForkBranchBase *)local_1b8.ownFile.content.size_ != (ForkBranchBase *)0x0) {
        local_1b8.ownFile.content.size_ = 0;
        (***(_func_int ***)local_1b8.ownFile.content.ptr)
                  (local_1b8.ownFile.content.ptr,
                   (_func_int *)
                   ((long)&(((PromiseNode *)sVar7)->super_PromiseArenaMember).
                           _vptr_PromiseArenaMember +
                   (long)(((PromiseNode *)sVar7)->super_PromiseArenaMember)._vptr_PromiseArenaMember
                         [-2]));
      }
    }
    if ((char)local_208.ptr == '\x01') {
      local_1b8.ownFile.content.ptr =
           (char *)kj::_::
                   TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:883:19)>
                   ::anon_class_8_1_8991fb9c_for_errorHandler::operator();
      local_1e0.ptr = (PromiseNode *)interfaceId;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::TransformPromiseNode<void,kj::_::IdentityFunc<void>,capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_2_>,kj::_::PromiseDisposer,kj::_::IdentityFunc<void>,capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_2_,void*&>
                ((PromiseDisposer *)&local_218,(OwnPromiseNode *)&local_208,&local_1f1,
                 (anon_class_8_1_8991fb9c_for_errorHandler *)&local_1e0,(void **)&local_1b8);
      local_1f0.client.ptr =
           (Maybe<capnp::LocalClient_&>)(Maybe<capnp::LocalClient_&>)local_218.disposer;
      *(undefined1 *)(interfaceId + 0x78) = 1;
      local_1b8.ownFile.content.ptr = (char *)interfaceId;
      kj::Promise<void>::attach<capnp::LocalClient::BlockingScope>((Promise<void> *)this,&local_1f0)
      ;
      pcVar6 = local_1b8.ownFile.content.ptr;
      if ((PromiseArenaMember *)local_1b8.ownFile.content.ptr != (PromiseArenaMember *)0x0) {
        *(undefined1 *)&((PromiseArenaMember *)((long)local_1b8.ownFile.content.ptr + 0x70))->arena
             = 0;
        while ((*(char *)&((PromiseArenaMember *)((long)pcVar6 + 0x70))->arena == '\0' &&
               (this_00 = (BlockedCall *)((PromiseArenaMember *)((long)pcVar6 + 0x210))->arena,
               this_00 != (BlockedCall *)0x0))) {
          BlockedCall::unblock(this_00);
        }
      }
      node.client.ptr = local_1f0.client.ptr;
      if (local_1f0.client.ptr != (LocalClient *)0x0) {
        local_1f0.client.ptr = (Maybe<capnp::LocalClient_&>)(LocalClient *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.client.ptr);
      }
    }
    else {
      (this->super_ClientHook)._vptr_ClientHook = (_func_int **)local_208.disposer;
      local_208.disposer = (Disposer *)0x0;
    }
    pDVar2 = local_208.disposer;
    if ((PromiseArenaMember *)local_208.disposer != (PromiseArenaMember *)0x0) {
      local_208.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar2);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> callInternal(uint64_t interfaceId, uint16_t methodId,
                                 CallContextHook& context) {
    KJ_ASSERT(!blocked);

    KJ_IF_SOME(e, brokenException) {
      // Previous streaming call threw, so everything fails from now on.
      return kj::cp(e);
    }

    // `server` can't be null here since `brokenException` is null.
    auto result = KJ_ASSERT_NONNULL(server)->dispatchCall(interfaceId, methodId,
                                       CallContext<AnyPointer, AnyPointer>(context));

    KJ_IF_SOME(r, revoker) {
      result.promise = r.wrap(kj::mv(result.promise));
    }

    if (!result.allowCancellation) {
      // Make sure this call cannot be canceled by forking the promise and detaching one branch.
      auto fork = result.promise.attach(kj::addRef(*this), context.addRef()).fork();
      result.promise = fork.addBranch();
      fork.addBranch().detach([](kj::Exception&&) {
        // Exception from canceled call is silently discarded. The caller should have waited for
        // it if they cared.
      });
    }

    if (result.isStreaming) {
      return result.promise
          .catch_([this](kj::Exception&& e) {
        brokenException = kj::cp(e);
        kj::throwRecoverableException(kj::mv(e));
      }).attach(BlockingScope(*this));
    } else {
      return kj::mv(result.promise);
    }
  }